

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O3

bool __thiscall
HighsCutGeneration::preprocessBaseInequality
          (HighsCutGeneration *this,bool *hasUnboundedInts,bool *hasGeneralInts,bool *hasContinuous)

{
  int iVar1;
  pointer pdVar2;
  pointer puVar3;
  double dVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  bool bVar5;
  uint uVar6;
  double *pdVar7;
  long lVar8;
  uint uVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  ulong uVar10;
  int *piVar11;
  size_type __new_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar12;
  ulong uVar13;
  int iVar14;
  undefined4 uVar15;
  double dVar16;
  double dVar17;
  vector<int,_std::allocator<int>_> cancelNzs;
  int expshift;
  int local_94;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_90;
  uint local_84;
  int local_80;
  int local_7c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  iterator iStack_70;
  int *local_68;
  undefined1 local_58 [16];
  ulong local_40;
  int local_34;
  
  *hasUnboundedInts = false;
  *hasContinuous = false;
  *hasGeneralInts = false;
  local_58._0_8_ = (ulong)this->feastol ^ 0x8000000000000000;
  local_58._8_4_ = 0;
  local_58._12_4_ = 0x80000000;
  if ((long)this->rowlen < 1) {
    dVar4 = 0.0;
  }
  else {
    dVar4 = 0.0;
    lVar8 = 0;
    do {
      if (dVar4 <= ABS(this->vals[lVar8])) {
        dVar4 = ABS(this->vals[lVar8]);
      }
      lVar8 = lVar8 + 1;
    } while (this->rowlen != lVar8);
  }
  local_34 = 0;
  frexp(dVar4,&local_34);
  iVar14 = -local_34;
  local_34 = iVar14;
  dVar4 = ldexp(1.0,iVar14);
  this->initialScale = dVar4;
  HighsCDouble::operator*=(&this->rhs,dVar4);
  __new_size = (size_type)this->rowlen;
  if (0 < (long)__new_size) {
    pdVar7 = this->vals;
    lVar8 = 0;
    do {
      dVar4 = ldexp(pdVar7[lVar8],iVar14);
      pdVar7 = this->vals;
      pdVar7[lVar8] = dVar4;
      lVar8 = lVar8 + 1;
      __new_size = (size_type)this->rowlen;
    } while (lVar8 < (long)__new_size);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->isintegral,__new_size);
  if (this->rowlen == 0) {
    uVar6 = 0;
    iVar14 = 0;
  }
  else {
    local_90 = &this->complementation;
    uVar10 = 0;
    iVar14 = 0;
    do {
      bVar5 = HighsLpRelaxation::isColIntegral(this->lpRelaxation,this->inds[uVar10]);
      if (bVar5) {
        bVar5 = this->feastol * 10.0 < ABS(this->vals[uVar10]);
      }
      else {
        bVar5 = false;
      }
      (this->isintegral).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar10] = bVar5;
      dVar4 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10];
      if ((this->isintegral).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar10] == '\0') {
        dVar16 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar10];
        if (dVar4 < dVar16 + dVar16) {
          if ((this->complementation).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start ==
              (this->complementation).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (local_90,(long)this->rowlen);
          }
          flipComplementation(this,(HighsInt)uVar10);
        }
        pdVar7 = this->vals;
        dVar4 = pdVar7[uVar10];
        if ((0.0 < dVar4) ||
           (ABS(dVar4) *
            (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar10] <= this->feastol * 10.0)) {
          if (dVar4 < 0.0) {
            dVar16 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10];
            if (INFINITY <= dVar16) {
              return false;
            }
            dVar4 = dVar4 * dVar16;
            dVar16 = (this->rhs).hi;
            dVar17 = dVar16 - dVar4;
            (this->rhs).hi = dVar17;
            (this->rhs).lo =
                 (dVar16 - (dVar4 + dVar17)) + (-dVar4 - (dVar17 - (dVar4 + dVar17))) +
                 (this->rhs).lo;
          }
          iVar14 = iVar14 + 1;
          pdVar7[uVar10] = 0.0;
        }
        else {
          *hasContinuous = true;
        }
      }
      else {
        if (dVar4 < INFINITY) {
          if ((dVar4 != 1.0) || (NAN(dVar4))) goto LAB_0027fa55;
        }
        else {
          *hasUnboundedInts = true;
LAB_0027fa55:
          *hasGeneralInts = true;
        }
        if (0.0 < this->vals[uVar10]) {
          uVar15 = local_58._12_4_;
          local_58._8_4_ = local_58._8_4_;
          local_58._0_8_ = local_58._0_8_ + this->vals[uVar10] * dVar4;
          local_58._12_4_ = uVar15;
        }
      }
      uVar10 = uVar10 + 1;
      uVar6 = this->rowlen;
    } while (uVar10 != uVar6);
  }
  local_7c = (int)((double)(this->lpRelaxation->lpsolver).model_.lp_.num_col_ * 0.15 + 100.0);
  local_80 = uVar6 - iVar14;
  uVar9 = local_80 - local_7c;
  if (uVar9 != 0 && local_7c <= local_80) {
    local_78._M_current = (int *)0x0;
    iStack_70._M_current = (int *)0x0;
    local_68 = (int *)0x0;
    local_94 = 0;
    if (uVar6 != 0) {
      do {
        lVar8 = (long)local_94;
        if (this->vals[lVar8] <= 0.0) {
          dVar4 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar8] -
                  (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar8];
        }
        else {
          dVar4 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar8];
        }
        if (dVar4 <= this->feastol) {
          if (iStack_70._M_current == local_68) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_78,iStack_70,&local_94);
          }
          else {
            *iStack_70._M_current = local_94;
            iStack_70._M_current = iStack_70._M_current + 1;
          }
        }
        local_94 = local_94 + 1;
      } while (local_94 != this->rowlen);
    }
    __first._M_current = local_78._M_current;
    uVar10 = (ulong)((long)iStack_70._M_current - (long)local_78._M_current) >> 2;
    if ((int)uVar9 <= (int)uVar10) {
      if ((int)uVar9 < (int)uVar10) {
        lVar8 = (long)(int)uVar9;
        piVar11 = local_78._M_current + lVar8;
        local_90 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)iStack_70;
        local_84 = uVar9;
        local_40 = uVar10;
        if (1 < (int)uVar9) {
          uVar10 = lVar8 - 2U >> 1;
          do {
            std::
            __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::preprocessBaseInequality(bool&,bool&,bool&)::__0>>
                      (__first,uVar10,lVar8,__first._M_current[uVar10],
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCutGeneration_cpp:974:42)>
                        )this);
            bVar5 = uVar10 != 0;
            uVar10 = uVar10 - 1;
          } while (bVar5);
        }
        uVar10 = local_40;
        pvVar12 = local_90;
        if (piVar11 < local_90) {
          do {
            iVar1 = *piVar11;
            if (ABS(this->vals[iVar1]) < ABS(this->vals[*__first._M_current])) {
              *piVar11 = *__first._M_current;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::preprocessBaseInequality(bool&,bool&,bool&)::__0>>
                        (__first,0,lVar8,iVar1,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCutGeneration_cpp:974:42)>
                          )this);
              pvVar12 = local_90;
            }
            piVar11 = piVar11 + 1;
          } while (piVar11 < pvVar12);
        }
        uVar9 = local_84;
        if (1 < (int)local_84) {
          lVar8 = (long)local_80 * 4 + (long)local_7c * -4;
          do {
            lVar8 = lVar8 + -4;
            iVar1 = *(__first._M_current + lVar8);
            *(__first._M_current + lVar8) = *__first._M_current;
            std::
            __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::preprocessBaseInequality(bool&,bool&,bool&)::__0>>
                      (__first,0,lVar8 >> 2,iVar1,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCutGeneration_cpp:974:42)>
                        )this);
          } while (4 < lVar8);
        }
      }
      if (0 < (int)uVar9) {
        pdVar2 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = this->vals;
        uVar13 = 0;
        do {
          iVar1 = local_78._M_current[uVar13];
          dVar4 = pdVar7[iVar1];
          dVar16 = dVar4 * pdVar2[iVar1];
          if (0.0 <= dVar4) {
            local_58._0_8_ = (double)local_58._0_8_ - dVar16;
          }
          else {
            dVar4 = (this->rhs).hi;
            dVar17 = dVar4 - dVar16;
            (this->rhs).hi = dVar17;
            (this->rhs).lo =
                 (dVar4 - (dVar16 + dVar17)) + (-dVar16 - (dVar17 - (dVar16 + dVar17))) +
                 (this->rhs).lo;
          }
          pdVar7[iVar1] = 0.0;
          uVar13 = uVar13 + 1;
        } while (uVar13 < uVar9);
      }
      iVar14 = iVar14 + uVar9;
    }
    if (local_78._M_current != (int *)0x0) {
      operator_delete(local_78._M_current);
    }
    if ((int)uVar10 < (int)uVar9) {
      return false;
    }
  }
  if (iVar14 != 0) {
    uVar6 = this->rowlen;
    if ((this->complementation).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (this->complementation).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      if (0 < (int)uVar6) {
        uVar10 = (ulong)uVar6 + 1;
        do {
          pdVar7 = this->vals;
          if ((pdVar7[uVar10 - 2] == 0.0) && (!NAN(pdVar7[uVar10 - 2]))) {
            iVar1 = this->rowlen;
            this->rowlen = iVar1 + -1;
            this->inds[uVar10 - 2] = this->inds[(long)iVar1 + -1];
            iVar1 = this->rowlen;
            pdVar7[uVar10 - 2] = pdVar7[iVar1];
            pdVar2 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar2[uVar10 - 2] = pdVar2[iVar1];
            pdVar2 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar2[uVar10 - 2] = pdVar2[iVar1];
            puVar3 = (this->isintegral).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar3[uVar10 - 2] = puVar3[iVar1];
            iVar14 = iVar14 + -1;
            if (iVar14 == 0) break;
          }
          uVar10 = uVar10 - 1;
        } while (1 < uVar10);
      }
    }
    else if (0 < (int)uVar6) {
      uVar10 = (ulong)uVar6 + 1;
      do {
        pdVar7 = this->vals;
        if ((pdVar7[uVar10 - 2] == 0.0) && (!NAN(pdVar7[uVar10 - 2]))) {
          iVar1 = this->rowlen;
          this->rowlen = iVar1 + -1;
          this->inds[uVar10 - 2] = this->inds[(long)iVar1 + -1];
          iVar1 = this->rowlen;
          pdVar7[uVar10 - 2] = pdVar7[iVar1];
          pdVar2 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar2[uVar10 - 2] = pdVar2[iVar1];
          pdVar2 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar2[uVar10 - 2] = pdVar2[iVar1];
          puVar3 = (this->isintegral).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar3[uVar10 - 2] = puVar3[iVar1];
          puVar3 = (this->complementation).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar3[uVar10 - 2] = puVar3[this->rowlen];
          iVar14 = iVar14 + -1;
          if (iVar14 == 0) break;
        }
        uVar10 = uVar10 - 1;
      } while (1 < uVar10);
    }
  }
  return (this->rhs).hi + (this->rhs).lo < (double)local_58._0_8_;
}

Assistant:

bool HighsCutGeneration::preprocessBaseInequality(bool& hasUnboundedInts,
                                                  bool& hasGeneralInts,
                                                  bool& hasContinuous) {
  // preprocess the inequality before cut generation
  // 1. Determine the maximal activity to check for trivial redundancy and
  // tighten coefficients
  // 2. Check for presence of continuous variables and unbounded integers as not
  // all methods for cut generation are applicable in that case
  // 3. Remove coefficients that are below the feasibility tolerance to avoid
  // numerical troubles, use bound constraints to cancel them and
  // reject base inequalities where that is not possible due to unbounded
  // variables
  hasUnboundedInts = false;
  hasContinuous = false;
  hasGeneralInts = false;
  HighsInt numZeros = 0;

  double maxact = -feastol;
  double maxAbsVal = 0;
  for (HighsInt i = 0; i < rowlen; ++i)
    maxAbsVal = std::max(std::abs(vals[i]), maxAbsVal);

  int expshift = 0;
  std::frexp(maxAbsVal, &expshift);
  expshift = -expshift;
  initialScale = std::ldexp(1.0, expshift);
  rhs *= initialScale;
  for (HighsInt i = 0; i < rowlen; ++i) vals[i] = std::ldexp(vals[i], expshift);

  isintegral.resize(rowlen);
  for (HighsInt i = 0; i != rowlen; ++i) {
    // we do not want to have integral variables with small coefficients as this
    // may lead to numerical instabilities during cut generation
    // Therefore we relax integral variables with small coefficients to
    // continuous ones because they still might have a non-negligible
    // contribution e.g. when they come from integral rows with coefficients on
    // the larger side. When we relax them to continuous variables they will be
    // complemented so that their solution value is closest to zero and then
    // will be relaxed if their value is positive or their maximal contribution
    // is below feasibility tolerance.
    isintegral[i] =
        lpRelaxation.isColIntegral(inds[i]) && std::abs(vals[i]) > 10 * feastol;

    if (!isintegral[i]) {
      // complement non-integer variable (cmir separation heuristic complements
      // integral variables in the same way)
      if (upper[i] < 2 * solval[i]) {
        if (complementation.empty()) complementation.resize(rowlen);

        flipComplementation(i);
      }

      // relax positive continuous variables and those with small contributions
      if (vals[i] > 0 || std::abs(vals[i]) * upper[i] <= 10 * feastol) {
        // printf("remove: vals[i] = %g  upper[i] = %g\n", vals[i], upper[i]);
        if (vals[i] < 0) {
          if (upper[i] == kHighsInf) return false;
          rhs -= vals[i] * upper[i];
        }

        ++numZeros;
        vals[i] = 0.0;
        continue;
      }

      hasContinuous = true;
      // if (lpRelaxation.isColIntegral(inds[i]))
      //   printf("vals[i] = %g  upper[i] = %g\n", vals[i], upper[i]);

      if (vals[i] > 0) {
        if (upper[i] == kHighsInf)
          maxact = kHighsInf;
        else
          maxact += vals[i] * upper[i];
      }
    } else {
      if (upper[i] == kHighsInf) {
        hasUnboundedInts = true;
        hasGeneralInts = true;
      } else if (upper[i] != 1.0) {
        hasGeneralInts = true;
      }

      if (vals[i] > 0) maxact += vals[i] * upper[i];
    }
  }

  HighsInt maxLen = 100 + 0.15 * (lpRelaxation.numCols());

  if (rowlen - numZeros > maxLen) {
    HighsInt numCancel = rowlen - numZeros - maxLen;
    std::vector<HighsInt> cancelNzs;

    for (HighsInt i = 0; i != rowlen; ++i) {
      double cancelSlack = vals[i] > 0 ? solval[i] : upper[i] - solval[i];
      if (cancelSlack <= feastol) cancelNzs.push_back(i);
    }

    if ((HighsInt)cancelNzs.size() < numCancel) return false;
    if ((HighsInt)cancelNzs.size() > numCancel)
      std::partial_sort(cancelNzs.begin(), cancelNzs.begin() + numCancel,
                        cancelNzs.end(), [&](HighsInt a, HighsInt b) {
                          return std::abs(vals[a]) < std::abs(vals[b]);
                        });

    for (HighsInt i = 0; i < numCancel; ++i) {
      HighsInt j = cancelNzs[i];

      if (vals[j] < 0) {
        rhs -= vals[j] * upper[j];
      } else
        maxact -= vals[j] * upper[j];

      vals[j] = 0.0;
    }

    numZeros += numCancel;
  }

  if (numZeros != 0) {
    // remove zeros in place
    if (complementation.empty()) {
      for (HighsInt i = rowlen - 1; i >= 0; --i) {
        if (vals[i] == 0.0) {
          --rowlen;
          inds[i] = inds[rowlen];
          vals[i] = vals[rowlen];
          upper[i] = upper[rowlen];
          solval[i] = solval[rowlen];
          isintegral[i] = isintegral[rowlen];
          if (--numZeros == 0) break;
        }
      }
    } else {
      for (HighsInt i = rowlen - 1; i >= 0; --i) {
        if (vals[i] == 0.0) {
          --rowlen;
          inds[i] = inds[rowlen];
          vals[i] = vals[rowlen];
          upper[i] = upper[rowlen];
          solval[i] = solval[rowlen];
          isintegral[i] = isintegral[rowlen];
          complementation[i] = complementation[rowlen];
          if (--numZeros == 0) break;
        }
      }
    }
  }

  return maxact > rhs;
}